

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

void slab_cache_create(slab_cache *cache,slab_arena *arena)

{
  long lVar1;
  size_t sVar2;
  byte local_21;
  uint8_t i;
  long min_order0_size;
  slab_arena *arena_local;
  slab_cache *cache_local;
  
  cache->arena = arena;
  lVar1 = small_getpagesize();
  if (lVar1 <= (long)(ulong)arena->slab_size) {
    sVar2 = small_lb((long)(ulong)arena->slab_size / lVar1);
    cache->order_max = (uint8_t)sVar2;
    if (0xf < cache->order_max) {
      cache->order_max = '\x0f';
    }
    cache->order0_size = arena->slab_size >> (cache->order_max & 0x1f);
    sVar2 = small_lb((ulong)cache->order0_size);
    cache->order0_size_lb = (uint8_t)sVar2;
    slab_list_create(&cache->allocated);
    for (local_21 = 0; local_21 <= cache->order_max; local_21 = local_21 + 1) {
      slab_list_create(cache->orders + local_21);
    }
    slab_cache_set_thread(cache);
    return;
  }
  __assert_fail("(long)arena->slab_size >= min_order0_size",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                ,0xb2,"void slab_cache_create(struct slab_cache *, struct slab_arena *)");
}

Assistant:

void
slab_cache_create(struct slab_cache *cache, struct slab_arena *arena)
{
	cache->arena = arena;
	/*
	 * We have a fixed number of orders (ORDER_MAX); calculate
	 * the size of buddies in the smallest order, given the size
	 * of the slab size in the slab arena.
	 */
	long min_order0_size = SLAB_MIN_ORDER0_SIZE;
	assert((long)arena->slab_size >= min_order0_size);
	cache->order_max = small_lb(arena->slab_size / min_order0_size);
	if (cache->order_max > ORDER_MAX - 1)
		cache->order_max = ORDER_MAX - 1;

	cache->order0_size = arena->slab_size >> cache->order_max;
	cache->order0_size_lb = small_lb(cache->order0_size);

	slab_list_create(&cache->allocated);
	uint8_t i;
	for (i = 0; i <= cache->order_max; i++)
		slab_list_create(&cache->orders[i]);
	slab_cache_set_thread(cache);

	VALGRIND_CREATE_MEMPOOL_EXT(cache, 0, 0, VALGRIND_MEMPOOL_METAPOOL |
				    VALGRIND_MEMPOOL_AUTO_FREE);
}